

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O0

void readHosts(string *filePath,Hosts *hosts)

{
  int port_00;
  bool bVar1;
  istream *piVar2;
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  Host local_300;
  int local_284;
  string local_280 [4];
  int port;
  string userName;
  string local_260 [8];
  string host;
  string local_240 [8];
  string displayName;
  istream local_220 [8];
  ifstream ifs;
  Hosts *hosts_local;
  string *filePath_local;
  
  std::ifstream::ifstream(local_220,(string *)filePath,_S_in);
  std::__cxx11::string::string(local_240);
  std::__cxx11::string::string(local_260);
  std::__cxx11::string::string(local_280);
  while( true ) {
    piVar2 = std::operator>>(local_220,local_240);
    piVar2 = std::operator>>(piVar2,local_260);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&local_284);
    piVar2 = std::operator>>(piVar2,local_280);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::string::string(local_320,local_240);
    std::__cxx11::string::string(local_340,local_260);
    port_00 = local_284;
    std::__cxx11::string::string(local_360,local_280);
    Host::Host(&local_300,(string *)local_320,(string *)local_340,port_00,(string *)local_360);
    std::vector<Host,_std::allocator<Host>_>::emplace_back<Host>(hosts,&local_300);
    Host::~Host(&local_300);
    std::__cxx11::string::~string(local_360);
    std::__cxx11::string::~string(local_340);
    std::__cxx11::string::~string(local_320);
  }
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_240);
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void readHosts(std::string filePath, Hosts &hosts) {
    std::ifstream ifs(filePath, std::ifstream::in);
    std::string displayName, host, userName;
    int port;
    while (ifs >> displayName >> host >> port >> userName) {
        hosts.emplace_back(Host(displayName, host, port, userName));
    }
}